

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

bool __thiscall
brotli::BrotliCompressor::WriteBrotliData
          (BrotliCompressor *this,bool is_last,bool force_flush,size_t *out_size,uint8_t **output)

{
  uint64_t uVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  Command *pCVar5;
  unsigned_long *puVar6;
  size_t sVar7;
  ulong num_bytes;
  undefined1 local_d0 [8];
  Command cmd;
  ulong local_b0;
  unsigned_long local_a8;
  size_t max_length;
  size_t newsize;
  int *table;
  size_t table_size;
  size_t storage_ix;
  uint8_t *storage;
  size_t max_out_size;
  uint32_t bytes;
  uint32_t mask;
  uint8_t *data;
  uint64_t delta;
  uint8_t **output_local;
  size_t *out_size_local;
  bool force_flush_local;
  BrotliCompressor *pBStack_40;
  bool is_last_local;
  BrotliCompressor *this_local;
  
  data = (uint8_t *)(this->input_pos_ - this->last_processed_pos_);
  delta = (uint64_t)output;
  output_local = (uint8_t **)out_size;
  out_size_local._6_1_ = force_flush;
  out_size_local._7_1_ = is_last;
  pBStack_40 = this;
  _bytes = RingBuffer::start(this->ringbuffer_);
  max_out_size._4_4_ = RingBuffer::mask(this->ringbuffer_);
  puVar2 = data;
  puVar4 = (uint8_t *)input_block_size(this);
  if (puVar4 < puVar2) {
    this_local._7_1_ = false;
  }
  else {
    max_out_size._0_4_ = (uint)data;
    if ((this->params_).quality < 2) {
      if ((data == (uint8_t *)0x0) && ((out_size_local._7_1_ & 1) == 0)) {
        *output_local = (uint8_t *)0x0;
        this_local._7_1_ = true;
      }
      else {
        storage = (uint8_t *)(ulong)((uint)max_out_size * 2 + 500);
        storage_ix = (size_t)GetBrotliStorage(this,(size_t)storage);
        *(uint8_t *)storage_ix = this->last_byte_;
        table_size = (size_t)this->last_byte_bits_;
        newsize = (size_t)GetHashTable(this,(this->params_).quality,(ulong)(uint)max_out_size,
                                       (size_t *)&table);
        puVar2 = _bytes;
        if ((this->params_).quality == 0) {
          uVar3 = WrapPosition(this->last_processed_pos_);
          BrotliCompressFragmentFast
                    (puVar2 + (uVar3 & max_out_size._4_4_),(ulong)(uint)max_out_size,
                     (bool)(out_size_local._7_1_ & 1),(int *)newsize,(size_t)table,this->cmd_depths_
                     ,this->cmd_bits_,&this->cmd_code_numbits_,this->cmd_code_,&table_size,
                     (uint8_t *)storage_ix);
        }
        else {
          uVar3 = WrapPosition(this->last_processed_pos_);
          BrotliCompressFragmentTwoPass
                    (puVar2 + (uVar3 & max_out_size._4_4_),(ulong)(uint)max_out_size,
                     (bool)(out_size_local._7_1_ & 1),this->command_buf_,this->literal_buf_,
                     (int *)newsize,(size_t)table,&table_size,(uint8_t *)storage_ix);
        }
        this->last_byte_ = *(uint8_t *)(storage_ix + (table_size >> 3));
        this->last_byte_bits_ = (byte)table_size & 7;
        this->last_processed_pos_ = this->input_pos_;
        *(size_t *)delta = storage_ix;
        *output_local = (uint8_t *)(table_size >> 3);
        this_local._7_1_ = true;
      }
    }
    else {
      max_length = this->num_commands_ + (ulong)((uint)max_out_size >> 1) + 1;
      if (this->cmd_alloc_size_ < max_length) {
        max_length = (((uint)max_out_size >> 2) + 0x10) + max_length;
        this->cmd_alloc_size_ = max_length;
        pCVar5 = (Command *)realloc(this->commands_,max_length * 0x18);
        this->commands_ = pCVar5;
      }
      num_bytes = (ulong)(uint)max_out_size;
      uVar3 = WrapPosition(this->last_processed_pos_);
      CreateBackwardReferences
                (num_bytes,(ulong)uVar3,(bool)(out_size_local._7_1_ & 1),_bytes,
                 (ulong)max_out_size._4_4_,(this->params_).quality,(this->params_).lgwin,
                 this->hashers_,this->hash_type_,this->dist_cache_,&this->last_insert_len_,
                 this->commands_ + this->num_commands_,&this->num_commands_,&this->num_literals_);
      local_b0 = (ulong)(max_out_size._4_4_ + 1);
      cmd.dist_extra_ = 0x1000000;
      cmd.cmd_prefix_ = 0;
      cmd.dist_prefix_ = 0;
      puVar6 = std::min<unsigned_long>(&local_b0,(unsigned_long *)&cmd.dist_extra_);
      local_a8 = *puVar6;
      if (((((out_size_local._7_1_ & 1) == 0) && ((out_size_local._6_1_ & 1) == 0)) &&
          ((3 < (this->params_).quality || (this->num_literals_ + this->num_commands_ < 0x2fff))))
         && (uVar1 = this->input_pos_, sVar7 = input_block_size(this),
            uVar1 + sVar7 <= this->last_flush_pos_ + local_a8)) {
        this->last_processed_pos_ = this->input_pos_;
        *output_local = (uint8_t *)0x0;
        return true;
      }
      if (this->last_insert_len_ != 0) {
        Command::Command((Command *)local_d0,this->last_insert_len_);
        sVar7 = this->num_commands_;
        this->num_commands_ = sVar7 + 1;
        pCVar5 = this->commands_ + sVar7;
        pCVar5->insert_len_ = local_d0._0_4_;
        pCVar5->copy_len_ = local_d0._4_4_;
        pCVar5->cmd_extra_ = cmd._0_8_;
        pCVar5->dist_extra_ = (undefined4)cmd.cmd_extra_;
        pCVar5->cmd_prefix_ = cmd.cmd_extra_._4_2_;
        pCVar5->dist_prefix_ = cmd.cmd_extra_._6_2_;
        this->num_literals_ = this->last_insert_len_ + this->num_literals_;
        this->last_insert_len_ = 0;
      }
      WriteMetaBlockInternal
                (this,(bool)(out_size_local._7_1_ & 1),(size_t *)output_local,(uint8_t **)delta);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BrotliCompressor::WriteBrotliData(const bool is_last,
                                       const bool force_flush,
                                       size_t* out_size,
                                       uint8_t** output) {
  const uint64_t delta = input_pos_ - last_processed_pos_;
  const uint8_t* data = ringbuffer_->start();
  const uint32_t mask = ringbuffer_->mask();

  if (delta > input_block_size()) {
    return false;
  }
  const uint32_t bytes = static_cast<uint32_t>(delta);

  if (params_.quality <= 1) {
    if (delta == 0 && !is_last) {
      // We have no new input data and we don't have to finish the stream, so
      // nothing to do.
      *out_size = 0;
      return true;
    }
    const size_t max_out_size = 2 * bytes + 500;
    uint8_t* storage = GetBrotliStorage(max_out_size);
    storage[0] = last_byte_;
    size_t storage_ix = last_byte_bits_;
    size_t table_size;
    int* table = GetHashTable(params_.quality, bytes, &table_size);
    if (params_.quality == 0) {
      BrotliCompressFragmentFast(
          &data[WrapPosition(last_processed_pos_) & mask],
          bytes, is_last,
          table, table_size,
          cmd_depths_, cmd_bits_,
          &cmd_code_numbits_, cmd_code_,
          &storage_ix, storage);
    } else {
      BrotliCompressFragmentTwoPass(
          &data[WrapPosition(last_processed_pos_) & mask],
          bytes, is_last,
          command_buf_, literal_buf_,
          table, table_size,
          &storage_ix, storage);
    }
    last_byte_ = storage[storage_ix >> 3];
    last_byte_bits_ = storage_ix & 7u;
    last_processed_pos_ = input_pos_;
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return true;
  }

  // Theoretical max number of commands is 1 per 2 bytes.
  size_t newsize = num_commands_ + bytes / 2 + 1;
  if (newsize > cmd_alloc_size_) {
    // Reserve a bit more memory to allow merging with a next block
    // without realloc: that would impact speed.
    newsize += (bytes / 4) + 16;
    cmd_alloc_size_ = newsize;
    commands_ =
        static_cast<Command*>(realloc(commands_, sizeof(Command) * newsize));
  }

  CreateBackwardReferences(bytes, WrapPosition(last_processed_pos_),
                           is_last, data, mask,
                           params_.quality,
                           params_.lgwin,
                           hashers_,
                           hash_type_,
                           dist_cache_,
                           &last_insert_len_,
                           &commands_[num_commands_],
                           &num_commands_,
                           &num_literals_);

  size_t max_length = std::min<size_t>(mask + 1, 1u << kMaxInputBlockBits);
  if (!is_last && !force_flush &&
      (params_.quality >= kMinQualityForBlockSplit ||
       (num_literals_ + num_commands_ < kMaxNumDelayedSymbols)) &&
      input_pos_ + input_block_size() <= last_flush_pos_ + max_length) {
    // Merge with next input block. Everything will happen later.
    last_processed_pos_ = input_pos_;
    *out_size = 0;
    return true;
  }

  // Create the last insert-only command.
  if (last_insert_len_ > 0) {
    brotli::Command cmd(last_insert_len_);
    commands_[num_commands_++] = cmd;
    num_literals_ += last_insert_len_;
    last_insert_len_ = 0;
  }

  WriteMetaBlockInternal(is_last, out_size, output);
  return true;
}